

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O2

bool __thiscall AgenPeeps::DependentOpnds(AgenPeeps *this,Opnd *opnd1,Opnd *opnd2)

{
  int iVar1;
  RegOpnd *pRVar2;
  bool bVar3;
  SymOpnd *pSVar4;
  RegOpnd *pRVar5;
  RegOpnd *pRVar6;
  IndirOpnd *pIVar7;
  SymOpnd *pSVar8;
  StackSym *pSVar9;
  
  if (opnd2 != (Opnd *)0x0 && opnd1 != (Opnd *)0x0) {
    bVar3 = IsMemoryOpnd(this,opnd1);
    if ((bVar3) && (bVar3 = IsMemoryOpnd(this,opnd2), bVar3)) {
      bVar3 = IR::Opnd::IsSymOpnd(opnd1);
      if (bVar3) {
        pSVar4 = IR::Opnd::AsSymOpnd(opnd1);
      }
      else {
        pSVar4 = (SymOpnd *)0x0;
      }
      bVar3 = IR::Opnd::IsSymOpnd(opnd2);
      if (bVar3) {
        pSVar8 = IR::Opnd::AsSymOpnd(opnd2);
      }
      else {
        pSVar8 = (SymOpnd *)0x0;
      }
      if (pSVar4 == (SymOpnd *)0x0 && pSVar8 == (SymOpnd *)0x0) {
        return true;
      }
      bVar3 = IR::Opnd::IsMemRefOpnd(opnd1);
      if (((!bVar3) && (bVar3 = IR::Opnd::IsMemRefOpnd(opnd2), !bVar3)) &&
         ((bVar3 = IR::Opnd::IsIndirOpnd(opnd1), !bVar3 &&
          (bVar3 = IR::Opnd::IsIndirOpnd(opnd2), !bVar3)))) {
        if (pSVar4 == (SymOpnd *)0x0 || pSVar8 == (SymOpnd *)0x0) {
          return true;
        }
        if (pSVar4->m_sym->m_kind != SymKindStack) {
          return true;
        }
        if (pSVar8->m_sym->m_kind != SymKindStack) {
          return true;
        }
        pSVar9 = Sym::AsStackSym(pSVar4->m_sym);
        iVar1 = pSVar9->m_offset;
        pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
        return iVar1 == pSVar9->m_offset;
      }
    }
    else {
      bVar3 = IR::Opnd::IsRegOpnd(opnd1);
      if (bVar3) {
        pRVar5 = IR::Opnd::AsRegOpnd(opnd1);
        bVar3 = IR::Opnd::IsRegOpnd(opnd2);
        if (bVar3) {
          pRVar6 = IR::Opnd::AsRegOpnd(opnd2);
          bVar3 = IR::RegOpnd::IsSameRegUntyped(pRVar5,&pRVar6->super_Opnd);
          if (bVar3) {
            return true;
          }
        }
        bVar3 = IR::Opnd::IsIndirOpnd(opnd2);
        if (bVar3) {
          pIVar7 = IR::Opnd::AsIndirOpnd(opnd2);
          pRVar6 = pIVar7->m_baseOpnd;
          pIVar7 = IR::Opnd::AsIndirOpnd(opnd2);
          pRVar2 = pIVar7->m_indexOpnd;
          if ((pRVar6 != (RegOpnd *)0x0) &&
             (bVar3 = IR::RegOpnd::IsSameRegUntyped(pRVar5,&pRVar6->super_Opnd), bVar3)) {
            return true;
          }
          if ((pRVar2 != (RegOpnd *)0x0) &&
             (bVar3 = IR::RegOpnd::IsSameRegUntyped(pRVar5,&pRVar2->super_Opnd), bVar3)) {
            return true;
          }
        }
        bVar3 = IR::Opnd::IsSymOpnd(opnd2);
        if (((bVar3) && (pSVar4 = IR::Opnd::AsSymOpnd(opnd2), pSVar4->m_sym->m_kind == SymKindStack)
            ) && (pRVar5->m_reg == RegRBP)) {
          return true;
        }
      }
      bVar3 = IR::Opnd::IsRegOpnd(opnd2);
      if (bVar3) {
        pRVar5 = IR::Opnd::AsRegOpnd(opnd2);
        bVar3 = IR::Opnd::IsIndirOpnd(opnd1);
        if (bVar3) {
          pIVar7 = IR::Opnd::AsIndirOpnd(opnd1);
          pRVar6 = pIVar7->m_baseOpnd;
          pIVar7 = IR::Opnd::AsIndirOpnd(opnd1);
          pRVar2 = pIVar7->m_indexOpnd;
          if ((pRVar6 != (RegOpnd *)0x0) &&
             (bVar3 = IR::RegOpnd::IsSameRegUntyped(pRVar5,&pRVar6->super_Opnd), bVar3)) {
            return true;
          }
          if ((pRVar2 != (RegOpnd *)0x0) &&
             (bVar3 = IR::RegOpnd::IsSameRegUntyped(pRVar5,&pRVar2->super_Opnd), bVar3)) {
            return true;
          }
        }
        bVar3 = IR::Opnd::IsSymOpnd(opnd1);
        if (((bVar3) && (pSVar4 = IR::Opnd::AsSymOpnd(opnd1), pSVar4->m_sym->m_kind == SymKindStack)
            ) && (pRVar5->m_reg == RegRBP)) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool AgenPeeps::DependentOpnds(IR::Opnd *opnd1, IR::Opnd *opnd2)
{
#if defined (_M_IX86)
    const RegNum baseReg = RegEBP;
#elif defined (_M_X64)
    const RegNum baseReg = RegRBP;
#else
    AssertMsg(false, "Optimization not supported for ARM");
#endif

    if (!opnd1 || !opnd2)
        return false;

    // Memory dependence
    if (IsMemoryOpnd(opnd1) && IsMemoryOpnd(opnd2))
    {
        IR::SymOpnd *symOpnd1 = opnd1->IsSymOpnd() ? opnd1->AsSymOpnd() : nullptr;
        IR::SymOpnd *symOpnd2 = opnd2->IsSymOpnd() ? opnd2->AsSymOpnd() : nullptr;

        if (symOpnd1 || symOpnd2)
        {
            // SymOpnd do not alias with  MemRefOpnd/IndirOpnd
            if (opnd1->IsMemRefOpnd() || opnd2->IsMemRefOpnd() || opnd1->IsIndirOpnd() || opnd2->IsIndirOpnd())
                return false;

            // Two symOpnds are dependent if they point to the same stack symbol
            if (symOpnd1 && symOpnd2 &&
                symOpnd1->m_sym->IsStackSym() && symOpnd2->m_sym->IsStackSym() )
            {
                return symOpnd1->m_sym->AsStackSym()->m_offset == symOpnd2->m_sym->AsStackSym()->m_offset;
            }
        }
        // all other memory operands are dependent
        return true;
    }

    IR::RegOpnd *regOpnd, *base, *index;

    // Register dependences
    if (opnd1->IsRegOpnd())
    {
        regOpnd = opnd1->AsRegOpnd();
        // reg-to-reg
        if (opnd2->IsRegOpnd() && regOpnd->IsSameRegUntyped(opnd2->AsRegOpnd()))
            return true;

        // opnd2 = [base + indx + offset] and (opnd1 = base or opnd1 = indx)
        if (opnd2->IsIndirOpnd())
        {
            base = opnd2->AsIndirOpnd()->GetBaseOpnd();
            index = opnd2->AsIndirOpnd()->GetIndexOpnd();
            if ( (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index)) )
                return true;
        }
        // opnd1 = ebp/rbp and opnd2 = [ebp/rbp + offset]
        if (opnd2->IsSymOpnd() && opnd2->AsSymOpnd()->m_sym->IsStackSym() && regOpnd->GetReg() == baseReg)
            return true;
    }

    if (opnd2->IsRegOpnd())
    {
        regOpnd = opnd2->AsRegOpnd();

        // opnd1 = [base + indx + offset] and (opnd2 = base or opnd2 = indx)
        if (opnd1->IsIndirOpnd())
        {
            base = opnd1->AsIndirOpnd()->GetBaseOpnd();
            index = opnd1->AsIndirOpnd()->GetIndexOpnd();
            if ( (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index)) )
                return true;
        }

        // opnd2 = ebp/rbp and opnd1 = [ebp/rbp + offset]
        if (opnd1->IsSymOpnd() && opnd1->AsSymOpnd()->m_sym->IsStackSym() && regOpnd->GetReg() == baseReg)
            return true;
    }
    return false;
}